

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenseMap.h
# Opt level: O2

void __thiscall
llvm::
SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
::deallocateBuckets(SmallDenseMap<unsigned_short,_llvm::detail::DenseSetEmpty,_4U,_llvm::DenseMapInfo<unsigned_short>,_llvm::detail::DenseSetPair<unsigned_short>_>
                    *this)

{
  DenseSetPair<unsigned_short> *pDVar1;
  LargeRep *pLVar2;
  
  if ((undefined1  [24])((undefined1  [24])*this & (undefined1  [24])0x1) == (undefined1  [24])0x0)
  {
    pLVar2 = getLargeRep(this);
    pDVar1 = pLVar2->Buckets;
    pLVar2 = getLargeRep(this);
    operator_delete(pDVar1,(ulong)pLVar2->NumBuckets * 2,2);
    getLargeRep(this);
    return;
  }
  return;
}

Assistant:

void deallocateBuckets() {
    if (Small)
      return;

    deallocate_buffer(getLargeRep()->Buckets,
                      sizeof(BucketT) * getLargeRep()->NumBuckets,
                      alignof(BucketT));
    getLargeRep()->~LargeRep();
  }